

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O2

bool Imf_3_2::checkOpenEXRFile
               (char *data,size_t numBytes,bool reduceMemory,bool reduceTime,bool runCoreCheck)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  char cVar4;
  bool bVar5;
  bool bVar6;
  __type _Var7;
  int iVar8;
  long lVar9;
  uint *puVar10;
  Header *pHVar11;
  bool reduceTime_00;
  bool reduceTime_01;
  bool reduceTime_02;
  undefined3 in_register_00000081;
  int maxTileHeight;
  int maxTileWidth;
  int maxImageHeight;
  int maxImageWidth;
  exr_context_t f;
  size_type local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  MultiPartInputFile multi;
  PtrIStream stream;
  
  if (CONCAT31(in_register_00000081,runCoreCheck) != 0) {
    _multi = 0x68;
    stream._0_8_ = data;
    stream._8_8_ = numBytes;
    bVar3 = reduceTime;
    iVar8 = exr_start_read(&f,"<memstream>");
    if (iVar8 != 0) {
      return true;
    }
    bVar3 = anon_unknown_0::checkCoreFile
                      ((anon_unknown_0 *)f,(exr_context_t)(ulong)reduceMemory,reduceTime,bVar3);
    exr_finish(&f);
    return bVar3;
  }
  Imf_3_2::IStream::IStream(&stream.super_IStream,"none");
  stream._0_8_ = &PTR__IStream_00128600;
  stream.end = data + numBytes;
  stream.base = data;
  stream.current = data;
  lVar9 = Imf_3_2::CompositeDeepScanLine::getMaximumSampleCount();
  Imf_3_2::Header::getMaxImageSize(&maxImageWidth,&maxImageHeight);
  Imf_3_2::Header::getMaxImageSize(&maxTileWidth,&maxTileHeight);
  if (reduceTime || reduceMemory) {
    Imf_3_2::CompositeDeepScanLine::setMaximumSampleCount(0x100000);
    Imf_3_2::Header::setMaxImageSize(0x800,0x800);
    Imf_3_2::Header::setMaxTileSize(0x200,0x200);
  }
  f = (exr_context_t)&local_e8;
  local_f0 = 0;
  local_e8._M_local_buf[0] = '\0';
  iVar8 = Imf_3_2::globalThreadCount();
  Imf_3_2::MultiPartInputFile::MultiPartInputFile(&multi,&stream.super_IStream,iVar8,true);
  Imf_3_2::MultiPartInputFile::header((int)&multi);
  Imf_3_2::Header::type_abi_cxx11_();
  std::__cxx11::string::_M_assign((string *)&f);
  cVar4 = Imf_3_2::isTiled((string *)&f);
  if (cVar4 == '\0') {
    bVar3 = false;
  }
  else {
    Imf_3_2::MultiPartInputFile::header((int)&multi);
    puVar10 = (uint *)Imf_3_2::Header::tileDescription();
    uVar1 = *puVar10;
    uVar2 = puVar10[1];
    pHVar11 = (Header *)Imf_3_2::MultiPartInputFile::header((int)&multi);
    iVar8 = Imf_3_2::calculateBytesPerPixel(pHVar11);
    bVar3 = 1000000 < (long)iVar8 * (ulong)uVar2 * (ulong)uVar1;
  }
  bVar5 = anon_unknown_0::readMultiPart(&multi,reduceMemory,reduceTime);
  Imf_3_2::MultiPartInputFile::~MultiPartInputFile(&multi);
  if (reduceMemory) {
    if (bVar3) goto LAB_001112a3;
  }
  else {
    (**(code **)(stream._0_8_ + 0x30))(&stream,0);
    iVar8 = Imf_3_2::globalThreadCount();
    Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&multi,&stream.super_IStream,iVar8);
    bVar6 = anon_unknown_0::readRgba((RgbaInputFile *)&multi,reduceTime,reduceTime_00);
    Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&multi);
    if (bVar6) {
      bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &f,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)DEEPTILE_abi_cxx11_);
      bVar5 = bVar5 || bVar6;
    }
    (**(code **)(stream._0_8_ + 0x30))(&stream,0);
    iVar8 = Imf_3_2::globalThreadCount();
    Imf_3_2::InputFile::InputFile((InputFile *)&multi,&stream.super_IStream,iVar8);
    bVar6 = anon_unknown_0::readScanline<Imf_3_2::InputFile>
                      ((InputFile *)&multi,reduceTime,reduceTime_01);
    Imf_3_2::InputFile::~InputFile((InputFile *)&multi);
    if (bVar6) {
      bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &f,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)DEEPTILE_abi_cxx11_);
      bVar5 = (bool)(bVar5 | bVar6);
    }
  }
  (**(code **)(stream._0_8_ + 0x30))(&stream,0);
  iVar8 = Imf_3_2::globalThreadCount();
  Imf_3_2::TiledInputFile::TiledInputFile((TiledInputFile *)&multi,&stream.super_IStream,iVar8);
  bVar6 = anon_unknown_0::readTile<Imf_3_2::TiledInputFile>
                    ((TiledInputFile *)&multi,reduceMemory,reduceTime);
  Imf_3_2::TiledInputFile::~TiledInputFile((TiledInputFile *)&multi);
  if (bVar6) {
    _Var7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            TILEDIMAGE_abi_cxx11_);
    bVar5 = (bool)(bVar5 | _Var7);
  }
  if (reduceMemory) {
    if (bVar3) goto LAB_001112a3;
  }
  else {
    (**(code **)(stream._0_8_ + 0x30))(&stream,0);
    iVar8 = Imf_3_2::globalThreadCount();
    Imf_3_2::DeepScanLineInputFile::DeepScanLineInputFile
              ((DeepScanLineInputFile *)&multi,&stream.super_IStream,iVar8);
    bVar3 = anon_unknown_0::readDeepScanLine<Imf_3_2::DeepScanLineInputFile>
                      ((DeepScanLineInputFile *)&multi,reduceTime,reduceTime_02);
    Imf_3_2::DeepScanLineInputFile::~DeepScanLineInputFile((DeepScanLineInputFile *)&multi);
    if (bVar3) {
      _Var7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &f,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)DEEPSCANLINE_abi_cxx11_);
      bVar5 = (bool)(bVar5 | _Var7);
    }
  }
  (**(code **)(stream._0_8_ + 0x30))(&stream,0);
  iVar8 = Imf_3_2::globalThreadCount();
  Imf_3_2::DeepTiledInputFile::DeepTiledInputFile
            ((DeepTiledInputFile *)&multi,&stream.super_IStream,iVar8);
  bVar3 = anon_unknown_0::readDeepTile<Imf_3_2::DeepTiledInputFile>
                    ((DeepTiledInputFile *)&multi,reduceMemory,reduceTime);
  Imf_3_2::DeepTiledInputFile::~DeepTiledInputFile((DeepTiledInputFile *)&multi);
  if (bVar3) {
    _Var7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            DEEPTILE_abi_cxx11_);
    bVar5 = (bool)(bVar5 | _Var7);
  }
LAB_001112a3:
  Imf_3_2::CompositeDeepScanLine::setMaximumSampleCount(lVar9);
  Imf_3_2::Header::setMaxImageSize(maxImageWidth,maxImageHeight);
  Imf_3_2::Header::setMaxTileSize(maxTileWidth,maxTileHeight);
  std::__cxx11::string::~string((string *)&f);
  Imf_3_2::IStream::~IStream(&stream.super_IStream);
  return bVar5;
}

Assistant:

bool
checkOpenEXRFile (
    const char* data,
    size_t      numBytes,
    bool        reduceMemory,
    bool        reduceTime,
    bool        runCoreCheck)
{


     if (runCoreCheck)
     {
        return runCoreChecks (data, numBytes, reduceMemory, reduceTime);
     }
     else
     {
        PtrIStream stream (data, numBytes);
        return runChecks (stream, reduceMemory, reduceTime);
    }


}